

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall HighsMipSolverData::performRestart(HighsMipSolverData *this)

{
  long lVar1;
  double dVar2;
  double dVar3;
  HighsInt HVar4;
  int iVar5;
  HighsLp *pHVar6;
  const_reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  size_t sVar10;
  pointer pHVar11;
  int iVar12;
  long *in_RDI;
  bool bound_change;
  double prev_lower_bound;
  HighsInt further_presolve_reduction_limit;
  HighsInt restart_presolve_reduction_limit;
  HighsInt num_reductions;
  HighsInt i_1;
  HighsInt numRow;
  HighsInt i;
  HighsBasis *basis;
  double offset;
  type integrality;
  HighsInt numCuts;
  HighsInt numModelRows;
  HighsInt numLpRows;
  HighsPseudocostInitialization pscostinit;
  HighsBasis root_basis;
  HighsInt in_stack_0000043c;
  HighsMipSolverData *in_stack_00000440;
  undefined1 in_stack_0000593f;
  vector<double,_std::allocator<double>_> *in_stack_00005940;
  HighsMipSolverData *in_stack_00005948;
  undefined4 in_stack_fffffffffffffd58;
  HighsInt in_stack_fffffffffffffd5c;
  pointer in_stack_fffffffffffffd60;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  size_type in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  value_type vVar13;
  size_type in_stack_fffffffffffffd88;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *this_00;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined2 uVar14;
  double in_stack_fffffffffffffe20;
  double in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  HighsMipSolverData *this_01;
  undefined1 local_180 [248];
  HighsPostsolveStack *in_stack_ffffffffffffff78;
  HighsInt in_stack_ffffffffffffff84;
  HighsPseudocost *in_stack_ffffffffffffff88;
  HighsPseudocostInitialization *in_stack_ffffffffffffff90;
  undefined1 local_68 [2];
  undefined1 local_66;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_38;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_20;
  
  HighsBasis::HighsBasis
            ((HighsBasis *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  HighsPseudocostInitialization::HighsPseudocostInitialization
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             in_stack_ffffffffffffff78);
  *(undefined1 **)(*in_RDI + 200) = local_180;
  *(int *)((long)in_RDI + 0x641c) = *(int *)((long)in_RDI + 0x641c) + 1;
  in_RDI[0xce8] = in_RDI[0xce7];
  in_RDI[0xce9] = in_RDI[0xce6];
  in_RDI[0xce9] = in_RDI[0xce6];
  in_RDI[0xcf1] = in_RDI[0xced];
  in_RDI[0xcf2] = in_RDI[0xcee];
  in_RDI[0xcf3] = in_RDI[0xcef];
  in_RDI[0xcf4] = in_RDI[0xcf0];
  pHVar6 = HighsLpRelaxation::getLp((HighsLpRelaxation *)0x628767);
  iVar5 = pHVar6->num_row_;
  HVar4 = HighsMipSolver::numRow((HighsMipSolver *)*in_RDI);
  if (0 < iVar5 - HVar4) {
    presolve::HighsPostsolveStack::appendCutsToModel
              ((HighsPostsolveStack *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (HighsInt)(in_stack_fffffffffffffd78 >> 0x20));
  }
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_fffffffffffffd60,
             (vector<HighsVarType,_std::allocator<HighsVarType>_> *)
             CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  lVar1 = in_RDI[0xc2e];
  HighsLpRelaxation::getLp((HighsLpRelaxation *)0x628855);
  HighsLp::operator=((HighsLp *)in_stack_fffffffffffffd60,
                     (HighsLp *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  in_RDI[0xc2e] = lVar1;
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator=
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
            );
  HVar4 = (HighsInt)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  this_01 = (HighsMipSolverData *)(in_RDI + 0xcd2);
  if (((ulong)this_01->mipsolver & 1) != 0) {
    presolve::HighsPostsolveStack::getOrigNumCol((HighsPostsolveStack *)(in_RDI + 0xbf2));
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78);
    presolve::HighsPostsolveStack::getOrigNumRow((HighsPostsolveStack *)(in_RDI + 0xbf2));
    in_stack_fffffffffffffe3c = CONCAT13(1,(int3)in_stack_fffffffffffffe3c);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88,
               (value_type *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    local_68[0] = 1;
    local_66 = 1;
    for (in_stack_fffffffffffffe38 = 0; in_stack_fffffffffffffe38 < **(int **)(*in_RDI + 0x10);
        in_stack_fffffffffffffe38 = in_stack_fffffffffffffe38 + 1) {
      pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          &(this_01->cutpool).matrix_.ARindex_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)in_stack_fffffffffffffe38
                         );
      vVar13 = *pvVar7;
      HVar4 = presolve::HighsPostsolveStack::getOrigColIndex
                        ((HighsPostsolveStack *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c)
      ;
      pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         (&local_38,(long)HVar4);
      *pvVar8 = vVar13;
    }
    sVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                      ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                       &(this_01->cutpool).matrix_.ARvalue_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    in_stack_fffffffffffffe34 = (int)sVar9;
    for (in_stack_fffffffffffffe30 = 0; HVar4 = (HighsInt)((ulong)in_stack_fffffffffffffd68 >> 0x20)
        , in_stack_fffffffffffffe30 < in_stack_fffffffffffffe34;
        in_stack_fffffffffffffe30 = in_stack_fffffffffffffe30 + 1) {
      pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          &(this_01->cutpool).matrix_.ARvalue_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)in_stack_fffffffffffffe30
                         );
      vVar13 = *pvVar7;
      this_00 = &local_20;
      HVar4 = presolve::HighsPostsolveStack::getOrigRowIndex
                        ((HighsPostsolveStack *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c)
      ;
      pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         (this_00,(long)HVar4);
      *pvVar8 = vVar13;
    }
    *(undefined1 **)(*in_RDI + 0xc0) = local_68;
  }
  in_RDI[0xcf9] = (long)((double)in_RDI[0xcf9] + *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
  in_RDI[0xcfa] = (long)((double)in_RDI[0xcfa] + *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
  in_RDI[0xcf8] = (long)((double)in_RDI[0xcf8] + *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
  in_RDI[0xcf7] = (long)((double)in_RDI[0xcf7] + *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x628b89);
  HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xfffffffffffffe20,0.0);
  in_RDI[0xce0] = (long)in_stack_fffffffffffffe20;
  in_RDI[0xce1] = (long)in_stack_fffffffffffffe28;
  HighsNodeQueue::clear
            ((HighsNodeQueue *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  std::__shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  sVar10 = presolve::HighsPostsolveStack::numReductions((HighsPostsolveStack *)0x628be8);
  iVar12 = (int)sVar10;
  iVar5 = *(int *)(*(long *)(*in_RDI + 8) + 0x244);
  if (iVar5 < 0) {
    iVar5 = -1;
  }
  else {
    iVar5 = iVar12 + iVar5;
  }
  runPresolve(in_stack_00000440,in_stack_0000043c);
  uVar14 = (undefined2)((uint)iVar12 >> 0x10);
  if (*(int *)(*in_RDI + 0x20) == 0) {
    runSetup((HighsMipSolverData *)
             pscostinit.ninferencesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
    presolve::HighsPostsolveStack::removeCutsFromModel
              ((HighsPostsolveStack *)CONCAT44(iVar5,in_stack_fffffffffffffd70),HVar4);
    if (*(undefined1 **)(*in_RDI + 0xc0) == local_68) {
      *(undefined8 *)(*in_RDI + 0xc0) = 0;
    }
    *(undefined8 *)(*in_RDI + 200) = 0;
  }
  else {
    in_RDI[0xcf9] = (long)((double)in_RDI[0xcf9] - *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
    in_RDI[0xcfa] = (long)((double)in_RDI[0xcfa] - *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
    if (*(int *)(*in_RDI + 0x20) == 7) {
      pHVar11 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            *)0x628ce8);
      pHVar11->upper_bound = 0.0;
      in_stack_fffffffffffffd60 =
           std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x628d0d);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x628d3b);
      transformNewIntegerFeasibleSolution
                (in_stack_00005948,in_stack_00005940,(bool)in_stack_0000593f);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(iVar5,in_stack_fffffffffffffd70));
    }
    else {
      in_RDI[0xcf8] = (long)((double)in_RDI[0xcf8] - *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
    }
    dVar2 = (double)in_RDI[0xcf7];
    dVar3 = *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8);
    in_RDI[0xcf7] = in_RDI[0xcf8];
    if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && ((double)in_RDI[0xcf7] != dVar2 - dVar3)) {
      updatePrimalDualIntegral
                (this_01,(double)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (double)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,SUB21((ushort)uVar14 >> 8,0),
                 SUB21(uVar14,0));
    }
    if (((*(double *)(*in_RDI + 0x40) != INFINITY) || (NAN(*(double *)(*in_RDI + 0x40)))) &&
       (*(int *)(*in_RDI + 0x20) == 8)) {
      *(undefined4 *)(*in_RDI + 0x20) = 7;
    }
  }
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
             CONCAT44(iVar5,in_stack_fffffffffffffd70));
  HighsPseudocostInitialization::~HighsPseudocostInitialization
            ((HighsPseudocostInitialization *)in_stack_fffffffffffffd60);
  HighsBasis::~HighsBasis((HighsBasis *)in_stack_fffffffffffffd60);
  return;
}

Assistant:

void HighsMipSolverData::performRestart() {
  HighsBasis root_basis;
  HighsPseudocostInitialization pscostinit(
      pseudocost, mipsolver.options_mip_->mip_pscost_minreliable,
      postSolveStack);

  mipsolver.pscostinit = &pscostinit;
  ++numRestarts;
  num_leaves_before_run = num_leaves;
  num_nodes_before_run = num_nodes;
  num_nodes_before_run = num_nodes;
  total_lp_iterations_before_run = total_lp_iterations;
  heuristic_lp_iterations_before_run = heuristic_lp_iterations;
  sepa_lp_iterations_before_run = sepa_lp_iterations;
  sb_lp_iterations_before_run = sb_lp_iterations;
  HighsInt numLpRows = lp.getLp().num_row_;
  HighsInt numModelRows = mipsolver.numRow();
  HighsInt numCuts = numLpRows - numModelRows;
  if (numCuts > 0) postSolveStack.appendCutsToModel(numCuts);
  auto integrality = std::move(presolvedModel.integrality_);
  double offset = presolvedModel.offset_;
  presolvedModel = lp.getLp();
  presolvedModel.offset_ = offset;
  presolvedModel.integrality_ = std::move(integrality);

  const HighsBasis& basis = firstrootbasis;
  if (basis.valid) {
    // if we have a basis after solving the root LP, we expand it to the
    // original space so that it can be used for constructing a starting basis
    // for the presolved model after the restart
    root_basis.col_status.resize(postSolveStack.getOrigNumCol());
    root_basis.row_status.resize(postSolveStack.getOrigNumRow(),
                                 HighsBasisStatus::kBasic);
    root_basis.valid = true;
    root_basis.useful = true;

    for (HighsInt i = 0; i < mipsolver.model_->num_col_; ++i)
      root_basis.col_status[postSolveStack.getOrigColIndex(i)] =
          basis.col_status[i];

    HighsInt numRow = basis.row_status.size();
    for (HighsInt i = 0; i < numRow; ++i)
      root_basis.row_status[postSolveStack.getOrigRowIndex(i)] =
          basis.row_status[i];

    mipsolver.rootbasis = &root_basis;
  }

  // Transform the reference of the objective limit and lower/upper
  // bounds to the original model, since offset will generally change
  // in presolve. Bound changes are transitory, so no real gap change,
  // and no update to P-D integral is necessary
  upper_limit += mipsolver.model_->offset_;
  optimality_limit += mipsolver.model_->offset_;

  upper_bound += mipsolver.model_->offset_;
  lower_bound += mipsolver.model_->offset_;

  // remove the current incumbent. Any incumbent is already transformed into the
  // original space and kept there
  incumbent.clear();
  pruned_treeweight = 0;
  nodequeue.clear();
  globalOrbits.reset();

  // Need to be able to set presolve reduction limit separately when
  // restarting - so that bugs in presolve restart can be investigated
  // independently (see #1553)
  //
  // However, when restarting, presolve is (naturally) applied to the
  // presolved problem, so have to control the number of _further_
  // presolve reductions
  //
  // The number of further presolve reductions must be positive,
  // otherwise the MIP solver cycles, hence
  // restart_presolve_reduction_limit cannot be zero
  //
  // Although postSolveStack.numReductions() is size_t, it makes no
  // sense to use presolve_reduction_limit when the number of
  // reductions is vast
  HighsInt num_reductions = HighsInt(postSolveStack.numReductions());
  HighsInt restart_presolve_reduction_limit =
      mipsolver.options_mip_->restart_presolve_reduction_limit;
  assert(restart_presolve_reduction_limit);
  HighsInt further_presolve_reduction_limit =
      restart_presolve_reduction_limit >= 0
          ? num_reductions + restart_presolve_reduction_limit
          : -1;
  runPresolve(further_presolve_reduction_limit);

  if (mipsolver.modelstatus_ != HighsModelStatus::kNotset) {
    // transform the objective limit to the current model
    upper_limit -= mipsolver.model_->offset_;
    optimality_limit -= mipsolver.model_->offset_;

    if (mipsolver.modelstatus_ == HighsModelStatus::kOptimal) {
      mipsolver.mipdata_->upper_bound = 0;
      mipsolver.mipdata_->transformNewIntegerFeasibleSolution(
          std::vector<double>());
    } else {
      upper_bound -= mipsolver.model_->offset_;
    }

    // lower_bound still relates to the original model, and the offset
    // is never applied, since MIP solving is complete, and
    // lower_bound is set to upper_bound, so apply the offset now, so
    // that housekeeping in updatePrimalDualIntegral is correct
    double prev_lower_bound = lower_bound - mipsolver.model_->offset_;

    lower_bound = upper_bound;

    // There must be a gap change, since it's now zero, so always call
    // updatePrimalDualIntegral (unless solving a sub-MIP)
    //
    // Surely there must be a lower bound change
    bool bound_change = lower_bound != prev_lower_bound;
    assert(bound_change);
    if (!mipsolver.submip && bound_change)
      updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                               upper_bound);
    if (mipsolver.solution_objective_ != kHighsInf &&
        mipsolver.modelstatus_ == HighsModelStatus::kInfeasible)
      mipsolver.modelstatus_ = HighsModelStatus::kOptimal;
    return;
  }
  // Bounds are currently in the original space since presolve will have
  // changed offset_
  runSetup();

  postSolveStack.removeCutsFromModel(numCuts);

  // HighsNodeQueue oldNodeQueue;
  // std::swap(nodequeue, oldNodeQueue);

  // remove the pointer into the stack-space of this function
  if (mipsolver.rootbasis == &root_basis) mipsolver.rootbasis = nullptr;
  mipsolver.pscostinit = nullptr;
}